

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfAnimationChannel(AnimationChannel *channel,json *o)

{
  char cVar1;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  json target;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  AnimationChannel *channel_local;
  
  local_18 = o;
  o_local = (json *)channel;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"sampler",&local_39);
  SerializeNumberProperty<int>(&local_38,*(int *)o_local,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_60,(nullptr_t)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"node",&local_81);
  SerializeNumberProperty<int>(&local_80,*(int *)&o_local->field_0x4,(json *)local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"path",&local_a9);
  SerializeStringProperty(&local_a8,(string *)&o_local->m_value,(json *)local_60);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  anon_unknown_57::JsonAddMember(local_18,"target",(json *)local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_60);
  cVar1 = Value::Type((Value *)&o_local[2].m_value);
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"extras",&local_d1);
    SerializeValue(&local_d0,(Value *)&o_local[2].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  SerializeExtensionMap((ExtensionMap *)(o_local + 0xc),local_18);
  return;
}

Assistant:

static void SerializeGltfAnimationChannel(AnimationChannel &channel, json &o) {
  SerializeNumberProperty("sampler", channel.sampler, o);
  {
    json target;
    SerializeNumberProperty("node", channel.target_node, target);
    SerializeStringProperty("path", channel.target_path, target);

    JsonAddMember(o, "target", std::move(target));
  }

  if (channel.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", channel.extras, o);
  }

  SerializeExtensionMap(channel.extensions, o);
}